

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O0

void __thiscall
TestMakeCmakeComment_Multiline_LastWithEndLine::TestMakeCmakeComment_Multiline_LastWithEndLine
          (TestMakeCmakeComment_Multiline_LastWithEndLine *this)

{
  Test *in_RDI;
  
  Test::Test(in_RDI,"MakeCmakeComment_Multiline_LastWithEndLine");
  in_RDI->_vptr_Test = (_func_int **)&PTR_Run_0018f6c0;
  return;
}

Assistant:

TEST(MakeCmakeComment_Multiline_LastWithEndLine) {
  const std::string contents("Multiple\n"
                             "lines\n"
                             "in\n"
                             "comment\n");
  const std::string expectedComment("# Multiple\n"
                                    "# lines\n"
                                    "# in\n"
                                    "# comment\n");

  std::string comment;
  MakeCmakeComment(comment, contents);
  ASSERT(comment == expectedComment);
}